

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool art_internal_validate_at(art_t *art,art_ref_t ref,art_internal_validate_t validator)

{
  long lVar1;
  byte bVar2;
  art_ref_t ref_00;
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  art_internal_validate_t validator_03;
  art_validate_cb_t p_Var3;
  art_t *art_00;
  _Bool _Var4;
  int iVar5;
  char **ppcVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  art_typecode_t typecode;
  void *pvVar17;
  int i;
  undefined8 uStack_50;
  art_key_chunk_t local_48;
  art_key_chunk_t aStack_47;
  undefined6 uStack_46;
  art_t *local_38;
  
  iVar5 = validator.depth;
  ppcVar6 = validator.reason;
  if (ref == 0) {
    pcVar9 = "node is null";
  }
  else if ((ref & 0xff) == 1) {
    pvVar17 = (void *)((ref >> 0xc & 0xfffffffffffffff0) + (long)art->nodes[1]);
    uVar7 = (ulong)(byte)validator.depth;
    validator.depth = iVar5;
    iVar5 = bcmp(pvVar17,validator.current_key,uVar7);
    ppcVar6 = validator.reason;
    if (iVar5 == 0) {
      if (validator.validate_cb == (art_validate_cb_t)0x0) {
        return true;
      }
      _Var4 = (*validator.validate_cb)
                        (*(art_val_t *)((long)pvVar17 + 8),validator.reason,validator.context);
      if (!_Var4) {
        if (*ppcVar6 != (char *)0x0) {
          return false;
        }
        *ppcVar6 = "leaf validation failed";
        return false;
      }
      return true;
    }
    pcVar9 = "leaf key does not match its position\'s prefix in the tree";
  }
  else {
    uVar7 = (ulong)(uint)((int)(ref & 0xff) << 3);
    lVar16 = *(long *)((long)art->nodes + uVar7);
    lVar14 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar7);
    bVar2 = *(byte *)(lVar16 + lVar14);
    if ((int)(validator.depth + (uint)bVar2) < 6) {
      lVar10 = lVar16 + lVar14;
      local_38 = art;
      memcpy(validator.current_key + validator.depth,(void *)(lVar10 + 1),(ulong)bVar2);
      art_00 = local_38;
      pvVar17 = validator.context;
      p_Var3 = validator.validate_cb;
      ppcVar6 = validator.reason;
      validator.depth = validator.depth + (uint)bVar2;
      switch((uint)ref & 0xff) {
      case 2:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        bVar2 = *(byte *)(lVar10 + 6);
        if (bVar2 == 0) {
          pcVar9 = "Node4 has no children";
        }
        else if (bVar2 < 5) {
          if (bVar2 == 1) {
            pcVar9 = "Node4 and child node should have been combined";
          }
          else {
            uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            uVar7 = 1;
            uVar12 = 0;
            while( true ) {
              if (*(byte *)(lVar10 + 6) <= uVar12) {
                return true;
              }
              if ((uVar12 != 0) &&
                 (*(byte *)(lVar10 + 7 + uVar12) <= *(byte *)(lVar10 + 6 + uVar12))) break;
              uVar11 = uVar7;
              while (uVar11 < *(byte *)(lVar10 + 6)) {
                lVar15 = uVar11 * 8;
                uVar11 = uVar11 + 1;
                if (*(long *)(lVar10 + 0x10 + uVar12 * 8) ==
                    *(long *)(lVar16 + lVar14 + 0x10 + lVar15)) {
                  pcVar9 = "Node4 has duplicate children";
                  goto LAB_001061c7;
                }
              }
              *(undefined1 *)((long)&uStack_50 + (long)(int)uStack_50 + 3) =
                   *(undefined1 *)(lVar10 + 7 + uVar12);
              validator_02.validate_cb = p_Var3;
              validator_02.reason = ppcVar6;
              validator_02.context = pvVar17;
              validator_02.depth = (int)uStack_50;
              validator_02.current_key[0] = uStack_50._4_1_;
              validator_02.current_key[1] = uStack_50._5_1_;
              validator_02.current_key[2] = uStack_50._6_1_;
              validator_02.current_key[3] = uStack_50._7_1_;
              validator_02.current_key[4] = local_48;
              validator_02.current_key[5] = aStack_47;
              validator_02._34_6_ = uStack_46;
              _Var4 = art_internal_validate_at
                                (art_00,*(art_ref_t *)(lVar10 + 0x10 + uVar12 * 8),validator_02);
              uVar7 = uVar7 + 1;
              uVar12 = uVar12 + 1;
              if (!_Var4) {
                return false;
              }
            }
            pcVar9 = "Node4 keys are not strictly increasing";
          }
        }
        else {
          pcVar9 = "Node4 has too many children";
        }
        break;
      case 3:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        if (*(byte *)(lVar10 + 6) < 5) {
          pcVar9 = "Node16 has too few children";
        }
        else if (*(byte *)(lVar10 + 6) < 0x11) {
          uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          lVar14 = lVar16 + 0x20 + lVar14;
          lVar16 = 1;
          uVar7 = 0;
          while( true ) {
            if (*(byte *)(lVar10 + 6) <= uVar7) {
              return true;
            }
            if ((uVar7 != 0) && (*(byte *)(lVar10 + 7 + uVar7) <= *(byte *)(lVar10 + 6 + uVar7)))
            break;
            lVar15 = 0;
            while ((ulong)(lVar15 + lVar16) < (ulong)*(byte *)(lVar10 + 6)) {
              lVar8 = lVar15 * 8;
              lVar15 = lVar15 + 1;
              if (*(long *)(lVar10 + 0x18 + uVar7 * 8) == *(long *)(lVar14 + lVar8)) {
                pcVar9 = "Node16 has duplicate children";
                goto LAB_001061c7;
              }
            }
            *(undefined1 *)((long)&uStack_50 + (long)(int)uStack_50 + 3) =
                 *(undefined1 *)(lVar10 + 7 + uVar7);
            validator_01.validate_cb = p_Var3;
            validator_01.reason = ppcVar6;
            validator_01.context = pvVar17;
            validator_01.depth = (int)uStack_50;
            validator_01.current_key[0] = uStack_50._4_1_;
            validator_01.current_key[1] = uStack_50._5_1_;
            validator_01.current_key[2] = uStack_50._6_1_;
            validator_01.current_key[3] = uStack_50._7_1_;
            validator_01.current_key[4] = local_48;
            validator_01.current_key[5] = aStack_47;
            validator_01._34_6_ = uStack_46;
            _Var4 = art_internal_validate_at
                              (art_00,*(art_ref_t *)(lVar10 + 0x18 + uVar7 * 8),validator_01);
            lVar16 = lVar16 + 1;
            lVar14 = lVar14 + 8;
            uVar7 = uVar7 + 1;
            if (!_Var4) {
              return false;
            }
          }
          pcVar9 = "Node16 keys are not strictly increasing";
        }
        else {
          pcVar9 = "Node16 has too many children";
        }
        break;
      case 4:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        if (*(byte *)(lVar10 + 6) < 0x11) {
          pcVar9 = "Node48 has too few children";
        }
        else if (*(byte *)(lVar10 + 6) < 0x31) {
          lVar16 = lVar10 + 0x110;
          uVar7 = 0;
          for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 1) {
            bVar2 = *(byte *)(lVar10 + 0x10 + lVar14);
            uVar12 = (ulong)bVar2;
            if (uVar12 != 0x30) {
              if ((uVar7 >> (uVar12 & 0x3f) & 1) != 0) {
                pcVar9 = "Node48 keys point to the same child index";
                goto LAB_001061c7;
              }
              if (*(long *)(lVar16 + uVar12 * 8) == 0) {
                pcVar9 = "Node48 has a NULL child";
                goto LAB_001061c7;
              }
              uVar7 = uVar7 | 1L << (bVar2 & 0x3f);
            }
          }
          if ((*(ulong *)(lVar10 + 8) ^ uVar7) == 0xffffffffffff) {
            do {
              if (uVar7 == 0) {
                uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
                lVar14 = 0;
                do {
                  if (lVar14 == 0x100) {
                    return true;
                  }
                  uVar7 = (ulong)*(byte *)(lVar10 + 0x10 + lVar14);
                  if (uVar7 != 0x30) {
                    *(char *)((long)&uStack_50 + (long)(int)uStack_50 + 3) = (char)lVar14;
                    validator_03.validate_cb = p_Var3;
                    validator_03.reason = ppcVar6;
                    validator_03.context = pvVar17;
                    validator_03.depth = (int)uStack_50;
                    validator_03.current_key[0] = uStack_50._4_1_;
                    validator_03.current_key[1] = uStack_50._5_1_;
                    validator_03.current_key[2] = uStack_50._6_1_;
                    validator_03.current_key[3] = uStack_50._7_1_;
                    validator_03.current_key[4] = local_48;
                    validator_03.current_key[5] = aStack_47;
                    validator_03._34_6_ = uStack_46;
                    _Var4 = art_internal_validate_at
                                      (art_00,*(art_ref_t *)(lVar16 + uVar7 * 8),validator_03);
                    if (!_Var4) {
                      return false;
                    }
                  }
                  lVar14 = lVar14 + 1;
                } while( true );
              }
              lVar14 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar7 = uVar7 & uVar7 - 1;
              for (uVar12 = uVar7; uVar12 != 0; uVar12 = uVar12 & uVar12 - 1) {
                lVar15 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                if (*(long *)(lVar16 + lVar14 * 8) == *(long *)(lVar16 + lVar15 * 8)) {
                  pcVar9 = "Node48 has duplicate children";
                  goto LAB_001061c7;
                }
              }
            } while( true );
          }
          pcVar9 = "Node48 available_children does not match actual children";
        }
        else {
          pcVar9 = "Node48 has too many children";
        }
        break;
      case 5:
        local_48 = validator.current_key[4];
        aStack_47 = validator.current_key[5];
        uStack_46 = validator._34_6_;
        if (*(ushort *)(lVar10 + 6) < 0x31) {
          pcVar9 = "Node256 has too few children";
        }
        else if (*(ushort *)(lVar10 + 6) < 0x101) {
          uStack_50 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          uVar13 = 0;
          for (lVar15 = 0; lVar15 != 0x100; lVar15 = lVar15 + 1) {
            ref_00 = *(art_ref_t *)(lVar10 + 8 + lVar15 * 8);
            if (ref_00 != 0) {
              uVar13 = uVar13 + 1;
              lVar8 = lVar15;
              while (lVar8 != 0xff) {
                lVar1 = lVar8 * 8;
                lVar8 = lVar8 + 1;
                if (ref_00 == *(art_ref_t *)(lVar16 + 0x10 + lVar14 + lVar1)) {
                  pcVar9 = "Node256 has duplicate children";
                  goto LAB_001061c7;
                }
              }
              *(char *)((long)&uStack_50 + (long)(int)uStack_50 + 3) = (char)lVar15;
              validator_00.validate_cb = p_Var3;
              validator_00.reason = ppcVar6;
              validator_00.context = pvVar17;
              validator_00.depth = (int)uStack_50;
              validator_00.current_key[0] = uStack_50._4_1_;
              validator_00.current_key[1] = uStack_50._5_1_;
              validator_00.current_key[2] = uStack_50._6_1_;
              validator_00.current_key[3] = uStack_50._7_1_;
              validator_00.current_key[4] = local_48;
              validator_00.current_key[5] = aStack_47;
              validator_00._34_6_ = uStack_46;
              _Var4 = art_internal_validate_at(art_00,ref_00,validator_00);
              if (!_Var4) {
                return false;
              }
            }
          }
          if (uVar13 == *(ushort *)(lVar10 + 6)) {
            return true;
          }
          pcVar9 = "Node256 count does not match actual children";
        }
        else {
          pcVar9 = "Node256 has too many children";
        }
        break;
      default:
        pcVar9 = "invalid node type";
      }
    }
    else {
      pcVar9 = "node has too much prefix at given depth";
    }
  }
LAB_001061c7:
  *ppcVar6 = pcVar9;
  return false;
}

Assistant:

static bool art_internal_validate_at(const art_t *art, art_ref_t ref,
                                     art_internal_validate_t validator) {
    if (ref == CROARING_ART_NULL_REF) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(&validator,
                                     "leaf key does not match its "
                                     "position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf->val, validator.reason,
                                   validator.context)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (art_ref_typecode(ref)) {
            case CROARING_ART_NODE4_TYPE:
                if (!art_node4_internal_validate(art, (art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE16_TYPE:
                if (!art_node16_internal_validate(
                        art, (art_node16_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE48_TYPE:
                if (!art_node48_internal_validate(
                        art, (art_node48_t *)inner_node, validator)) {
                    return false;
                }
                break;
            case CROARING_ART_NODE256_TYPE:
                if (!art_node256_internal_validate(
                        art, (art_node256_t *)inner_node, validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}